

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Refal2::CParser::parsingBlank(CParser *this)

{
  TParsingElementState TVar1;
  bool bVar2;
  code *pcVar3;
  
  if (((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type == TT_Word
      ) && (bVar2 = CDirectiveParser::StartParseIfDirective(&this->super_CDirectiveParser), bVar2))
  {
    this->state = (TState)parsingDirective;
    goto code_r0x00127b7e;
  }
  if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type ==
      TT_LineFeed) {
LAB_00127b9a:
    pcVar3 = parsingInitial;
  }
  else {
    bVar2 = CRuleParser::BeginRule((CRuleParser *)this);
    if (bVar2) {
      this->state = (TState)parsingRule;
      *(undefined8 *)&this->field_0x1f68 = 0;
      CRuleParser::AddToken((CRuleParser *)this);
      TVar1 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.
              super_CParsingElementState.state;
      if (TVar1 == PES_Wrong) {
        this->state = (TState)parsingIgnoreLine;
        *(undefined8 *)&this->field_0x1f68 = 0;
        if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type !=
            TT_LineFeed) {
          return;
        }
      }
      else if (TVar1 != PES_Correct) {
        return;
      }
      goto LAB_00127b9a;
    }
    pcVar3 = parsingIgnoreLine;
  }
  this->state = (TState)pcVar3;
code_r0x00127b7e:
  *(undefined8 *)&this->field_0x1f68 = 0;
  return;
}

Assistant:

void CParser::parsingBlank()
{
	if( token.type == TT_Word && CDirectiveParser::StartParseIfDirective() ) {
		state = &CParser::parsingDirective;
	} else if( token.type == TT_LineFeed ) {
		state = &CParser::parsingInitial;
	} else {
		if( !CRuleParser::BeginRule() ) {
			state = &CParser::parsingIgnoreLine;
			return;
		}
		state = &CParser::parsingRule;
		AddToken();
	}
}